

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
cfgfile::details::parser_base_t<cfgfile::qstring_trait_t>::check_parser_state_after_parsing
          (parser_base_t<cfgfile::qstring_trait_t> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  _Elt_pointer pptVar4;
  logic_error *plVar5;
  string local_e8;
  qstring_wrapper_t local_c8;
  qstring_wrapper_t local_a8;
  string_t local_90;
  string_t local_78;
  qstring_wrapper_t local_60;
  string local_48;
  
  if ((this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    plVar5 = (logic_error *)__cxa_allocate_exception(0x28);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Unexpected end of file. Still unfinished tag \"","");
    qstring_trait_t::from_ascii(&local_78,&local_e8);
    pptVar4 = (this->m_stack).c.
              super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar4 ==
        (this->m_stack).c.
        super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pptVar4 = (this->m_stack).c.
                super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    operator+(&local_60,&local_78,&pptVar4[-1]->m_name);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\".","");
    qstring_trait_t::from_ascii(&local_90,&local_48);
    operator+(&local_a8,&local_60,&local_90);
    std::logic_error::logic_error(plVar5,"Please use desc() method of the exception.");
    *(undefined ***)plVar5 = &PTR__exception_t_00164c08;
    uVar1 = local_a8.m_str.d.d._0_4_;
    uVar2 = local_a8.m_str.d.d._4_4_;
    local_a8.m_str.d.d = (Data *)0x0;
    *(undefined4 *)(plVar5 + 0x10) = uVar1;
    *(undefined4 *)(plVar5 + 0x14) = uVar2;
    *(undefined4 *)(plVar5 + 0x18) = local_a8.m_str.d.ptr._0_4_;
    *(undefined4 *)(plVar5 + 0x1c) = local_a8.m_str.d.ptr._4_4_;
    local_a8.m_str.d.ptr = (char16_t *)0x0;
    *(qsizetype *)(plVar5 + 0x20) = local_a8.m_str.d.size;
    local_a8.m_str.d.size = 0;
    __cxa_throw(plVar5,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  if (this->m_tag->m_is_mandatory == true) {
    bVar3 = tag_t<cfgfile::qstring_trait_t>::is_defined(this->m_tag);
    if (!bVar3) {
      plVar5 = (logic_error *)__cxa_allocate_exception(0x28);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Undefined mandatory tag: \"","");
      qstring_trait_t::from_ascii(&local_78,&local_e8);
      operator+(&local_60,&local_78,&this->m_tag->m_name);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\".","");
      qstring_trait_t::from_ascii(&local_90,&local_48);
      operator+(&local_c8,&local_60,&local_90);
      std::logic_error::logic_error(plVar5,"Please use desc() method of the exception.");
      *(undefined ***)plVar5 = &PTR__exception_t_00164c08;
      uVar1 = local_c8.m_str.d.d._0_4_;
      uVar2 = local_c8.m_str.d.d._4_4_;
      local_c8.m_str.d.d = (Data *)0x0;
      *(undefined4 *)(plVar5 + 0x10) = uVar1;
      *(undefined4 *)(plVar5 + 0x14) = uVar2;
      *(undefined4 *)(plVar5 + 0x18) = local_c8.m_str.d.ptr._0_4_;
      *(undefined4 *)(plVar5 + 0x1c) = local_c8.m_str.d.ptr._4_4_;
      local_c8.m_str.d.ptr = (char16_t *)0x0;
      *(qsizetype *)(plVar5 + 0x20) = local_c8.m_str.d.size;
      local_c8.m_str.d.size = 0;
      __cxa_throw(plVar5,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
  }
  return;
}

Assistant:

void check_parser_state_after_parsing()
	{
		if( !m_stack.empty() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Still unfinished tag \"" ) + m_stack.top()->name() +
				Trait::from_ascii( "\"." ) );

		if( m_tag.is_mandatory() && !m_tag.is_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined mandatory tag: \"" ) +
				m_tag.name() + Trait::from_ascii( "\"." ) );
	}